

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O1

bool __thiscall BookChoose::loadBook(BookChoose *this)

{
  Board *this_00;
  bool bVar1;
  mapped_type *pmVar2;
  undefined8 extraout_RAX;
  int iVar3;
  int col;
  int iVar4;
  int row;
  int iVar5;
  char mov;
  UCT uct;
  char ch;
  int bookSize;
  int I;
  BitBoard op;
  BitBoard my;
  Board tmpBoard;
  ifstream in;
  char local_2cb;
  FullSearch local_2ca;
  char local_2c9;
  undefined1 local_2c8 [120];
  Position local_250;
  ulong local_248;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,"./book.bin",_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    loadBook();
  }
  std::istream::read((char *)local_238,(long)(local_2c8 + 0x10));
  if ((int)local_2c8._16_4_ < 1 || (abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    fwrite("Opening Book size error !\n",0x1a,1,_stderr);
    std::ifstream::close();
  }
  else {
    fprintf(_stderr,"bookSize:%d\n");
    FullSearch::FullSearch(&local_2ca);
    if (0 < (int)local_2c8._16_4_) {
      iVar4 = 0;
      this_00 = (Board *)(local_2c8 + 0x38);
      do {
        Board::Board(this_00);
        std::istream::read((char *)local_238,(long)(local_2c8 + 0x28));
        std::istream::read((char *)local_238,(long)(local_2c8 + 0x20));
        local_248 = local_2c8._32_8_ | local_2c8._40_8_;
        local_250.row = local_2c8._40_4_;
        local_250.col = local_2c8._44_4_;
        local_2c8._24_4_ = iVar4;
        Board::countBoard((Board *)local_2c8);
        std::istream::read((char *)local_238,(long)&local_2cb);
        if ('\0' < local_2cb) {
          iVar4 = 0;
          local_2c8._20_4_ = 0;
          do {
            local_248 = local_2c8._32_8_ | local_2c8._40_8_;
            local_250.row = local_2c8._40_4_;
            local_250.col = local_2c8._44_4_;
            std::istream::read((char *)local_238,(long)&local_2c9);
            std::istream::read((char *)local_238,(long)(local_2c8 + 0x1c));
            iVar5 = (int)local_2c9;
            iVar3 = iVar5 + 7;
            if (-1 < local_2c9) {
              iVar3 = iVar5;
            }
            iVar3 = iVar3 >> 3;
            row = 7 - iVar3;
            iVar5 = iVar5 % 8;
            col = 7 - iVar5;
            Position::Position((Position *)(local_2c8 + 0x30),row,col);
            bVar1 = Board::isAbleToChoose(this_00,(Position)local_2c8._48_8_);
            if (!bVar1) {
              loadBook();
              FullSearch::~FullSearch(&local_2ca);
              std::ifstream::~ifstream(local_238);
              _Unwind_Resume(extraout_RAX);
            }
            if ((int)local_2c8._28_4_ < -99999) {
              Position::Position((Position *)local_2c8,row,col);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&BadChoose,this_00);
              pmVar2->row = local_2c8._0_4_;
              pmVar2->col = local_2c8._4_4_;
              Board::turnLeft(this_00);
              Position::Position((Position *)local_2c8,iVar5,row);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&BadChoose,this_00);
              pmVar2->row = local_2c8._0_4_;
              pmVar2->col = local_2c8._4_4_;
              Board::turnLeft(this_00);
              Position::Position((Position *)local_2c8,iVar3,iVar5);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&BadChoose,this_00);
              pmVar2->row = local_2c8._0_4_;
              pmVar2->col = local_2c8._4_4_;
              Board::turnLeft(this_00);
              Position::Position((Position *)local_2c8,col,iVar3);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&BadChoose,this_00);
              pmVar2->row = local_2c8._0_4_;
              pmVar2->col = local_2c8._4_4_;
            }
            else if (0 < (int)local_2c8._28_4_ && (local_2c8._20_4_ & 1) == 0) {
              Position::Position((Position *)local_2c8,row,col);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&GoodChoose,this_00);
              pmVar2->row = local_2c8._0_4_;
              pmVar2->col = local_2c8._4_4_;
              Board::turnLeft(this_00);
              Position::Position((Position *)local_2c8,iVar5,row);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&GoodChoose,this_00);
              pmVar2->row = local_2c8._0_4_;
              pmVar2->col = local_2c8._4_4_;
              Board::turnLeft(this_00);
              Position::Position((Position *)local_2c8,iVar3,iVar5);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&GoodChoose,this_00);
              pmVar2->row = local_2c8._0_4_;
              pmVar2->col = local_2c8._4_4_;
              Board::turnLeft(this_00);
              Position::Position((Position *)local_2c8,col,iVar3);
              pmVar2 = std::__detail::
                       _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&GoodChoose,this_00);
              pmVar2->row = local_2c8._0_4_;
              pmVar2->col = local_2c8._4_4_;
              local_2c8._20_4_ = (undefined4)CONCAT71((int7)((ulong)pmVar2 >> 8),1);
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 < local_2cb);
        }
        iVar4 = local_2c8._24_4_ + 1;
      } while (iVar4 < (int)local_2c8._16_4_);
    }
    fprintf(_stderr,"Good_size:%lu\n",GoodChoose._M_h._M_element_count);
    fprintf(_stderr,"Bad_size:%lu\n",BadChoose._M_h._M_element_count);
    std::ifstream::close();
    FullSearch::~FullSearch(&local_2ca);
  }
  std::ifstream::~ifstream(local_238);
  return true;
}

Assistant:

bool BookChoose::loadBook() {
    std::ifstream in("./book.bin", std::ios::binary | std::ios::in);
    if (!in) {
        fprintf(stderr, "cannot find Opening Book!\n");
    }

    int bookSize;
    in.read((char *) &bookSize, sizeof(bookSize));
    if (!in || bookSize <= 0) {
        fprintf(stderr, "Opening Book size error !\n");
        in.close();
        return true;
    }

    //book = new Book(bookSize * 3 / 2);
    fprintf(stderr,"bookSize:%d\n",bookSize);
    UCT uct;
    for (int i = 0; i < bookSize; i++) {
        Board tmpBoard;
        //BookNode node;
        BitBoard my,op;
        char ch, mov;
        int I;
        in.read((char *) &my, sizeof(my));
        //node.setMy(bb);
        in.read((char *) &op, sizeof(op));
        //node.setOp(bb);
        tmpBoard.used = my|op;
        tmpBoard.board = my;

        //tmpBoard.printBoard();
        //uct.getNextAction(tmpBoard);
        int black,white ;
        tie(ignore,black,white) = tmpBoard.countBoard();
        in.read(&mov, sizeof(mov));
        //node.setMoveCount(ch);
        //printf("mov:%d\n",mov);
        bool hasGood = false;
        for (int j = 0; j < mov; j++) {
            tmpBoard.used = my|op;
            tmpBoard.board = my;
            in.read(&ch, sizeof(ch));
            in.read((char *) &I, sizeof(I));
            int row= 7-ch/8 , col = 7-ch%8;
//
//            int whiteNum,blackNum;
//            tie(ignore, whiteNum, blackNum) = tmpBoard.countBoard();

            if(!tmpBoard.isAbleToChoose(Position(row,col))){
                fprintf(stderr,"errror!!!");
                exit(1);
            }

            if (I<-99999){
                BadChoose[tmpBoard]=Position(row,col);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(7-col,row);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(7-row,7-col);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(col,7-row);
                continue;
            }
            if (!hasGood && I>0){
                GoodChoose[tmpBoard]=Position(row,col);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(7-col,row);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(7-row,7-col);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(col,7-row);
                hasGood = true;
                continue;
            }




            //node.setMove(j, ch);
            //node.setEval(j, I);
//        }
//        if (!in) {
//            delete book;
//            book = nullptr;
//            in.close();
//            return false;
//        }
//        book->insert(node);
        }

    }
    fprintf(stderr,"Good_size:%lu\n",GoodChoose.size());
    fprintf(stderr, "Bad_size:%lu\n",BadChoose.size());
    in.close();
    return true;
}